

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t icu_63::number::impl::NumberFormatterImpl::formatStatic
                  (MacroProps *macros,DecimalQuantity *inValue,NumberStringBuilder *outString,
                  UErrorCode *status)

{
  UBool UVar1;
  int32_t end;
  int32_t iVar2;
  MicroProps *micros_00;
  int32_t length;
  MicroProps *micros;
  NumberFormatterImpl impl;
  UErrorCode *status_local;
  NumberStringBuilder *outString_local;
  DecimalQuantity *inValue_local;
  MacroProps *macros_local;
  
  impl.fWarehouse.fCurrencySymbols.fIntlCurrencySymbol.fUnion._48_8_ = status;
  NumberFormatterImpl((NumberFormatterImpl *)&micros,macros,false,status);
  micros_00 = preProcessUnsafe((NumberFormatterImpl *)&micros,inValue,
                               (UErrorCode *)
                               impl.fWarehouse.fCurrencySymbols.fIntlCurrencySymbol.fUnion._48_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)
                       impl.fWarehouse.fCurrencySymbols.fIntlCurrencySymbol.fUnion._48_8_);
  if (UVar1 == '\0') {
    end = writeNumber(micros_00,inValue,outString,0,
                      (UErrorCode *)
                      impl.fWarehouse.fCurrencySymbols.fIntlCurrencySymbol.fUnion._48_8_);
    iVar2 = writeAffixes(micros_00,outString,0,end,
                         (UErrorCode *)
                         impl.fWarehouse.fCurrencySymbols.fIntlCurrencySymbol.fUnion._48_8_);
    macros_local._4_4_ = iVar2 + end;
  }
  else {
    macros_local._4_4_ = 0;
  }
  ~NumberFormatterImpl((NumberFormatterImpl *)&micros);
  return macros_local._4_4_;
}

Assistant:

int32_t NumberFormatterImpl::formatStatic(const MacroProps& macros, DecimalQuantity& inValue,
                                       NumberStringBuilder& outString, UErrorCode& status) {
    NumberFormatterImpl impl(macros, false, status);
    MicroProps& micros = impl.preProcessUnsafe(inValue, status);
    if (U_FAILURE(status)) { return 0; }
    int32_t length = writeNumber(micros, inValue, outString, 0, status);
    length += writeAffixes(micros, outString, 0, length, status);
    return length;
}